

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O0

void __thiscall
Assimp::AssbinExport::WriteBinaryScene(AssbinExport *this,IOStream *container,aiScene *scene)

{
  aiCamera *cam;
  uint i_5;
  aiLight *l;
  uint i_4;
  aiTexture *mesh_1;
  uint i_3;
  aiAnimation *anim;
  uint i_2;
  aiMaterial *mat;
  uint i_1;
  aiMesh *mesh;
  uint i;
  undefined1 local_58 [8];
  AssbinChunkWriter chunk;
  aiScene *scene_local;
  IOStream *container_local;
  AssbinExport *this_local;
  
  chunk.initial = (size_t)scene;
  AssbinChunkWriter::AssbinChunkWriter((AssbinChunkWriter *)local_58,container,0x1239,0x1000);
  Write<unsigned_int>((IOStream *)local_58,(uint *)chunk.initial);
  Write<unsigned_int>((IOStream *)local_58,(uint *)(chunk.initial + 0x10));
  Write<unsigned_int>((IOStream *)local_58,(uint *)(chunk.initial + 0x20));
  Write<unsigned_int>((IOStream *)local_58,(uint *)(chunk.initial + 0x30));
  Write<unsigned_int>((IOStream *)local_58,(uint *)(chunk.initial + 0x40));
  Write<unsigned_int>((IOStream *)local_58,(uint *)(chunk.initial + 0x50));
  Write<unsigned_int>((IOStream *)local_58,(uint *)(chunk.initial + 0x60));
  WriteBinaryNode(this,(IOStream *)local_58,*(aiNode **)(chunk.initial + 8));
  for (mesh._0_4_ = 0; (uint)mesh < *(uint *)(chunk.initial + 0x10); mesh._0_4_ = (uint)mesh + 1) {
    WriteBinaryMesh(this,(IOStream *)local_58,
                    *(aiMesh **)(*(long *)(chunk.initial + 0x18) + (ulong)(uint)mesh * 8));
  }
  for (mat._4_4_ = 0; mat._4_4_ < *(uint *)(chunk.initial + 0x20); mat._4_4_ = mat._4_4_ + 1) {
    WriteBinaryMaterial(this,(IOStream *)local_58,
                        *(aiMaterial **)(*(long *)(chunk.initial + 0x28) + (ulong)mat._4_4_ * 8));
  }
  for (anim._4_4_ = 0; anim._4_4_ < *(uint *)(chunk.initial + 0x30); anim._4_4_ = anim._4_4_ + 1) {
    WriteBinaryAnim(this,(IOStream *)local_58,
                    *(aiAnimation **)(*(long *)(chunk.initial + 0x38) + (ulong)anim._4_4_ * 8));
  }
  for (mesh_1._4_4_ = 0; mesh_1._4_4_ < *(uint *)(chunk.initial + 0x40);
      mesh_1._4_4_ = mesh_1._4_4_ + 1) {
    WriteBinaryTexture(this,(IOStream *)local_58,
                       *(aiTexture **)(*(long *)(chunk.initial + 0x48) + (ulong)mesh_1._4_4_ * 8));
  }
  for (l._4_4_ = 0; l._4_4_ < *(uint *)(chunk.initial + 0x50); l._4_4_ = l._4_4_ + 1) {
    WriteBinaryLight(this,(IOStream *)local_58,
                     *(aiLight **)(*(long *)(chunk.initial + 0x58) + (ulong)l._4_4_ * 8));
  }
  for (cam._4_4_ = 0; cam._4_4_ < *(uint *)(chunk.initial + 0x60); cam._4_4_ = cam._4_4_ + 1) {
    WriteBinaryCamera(this,(IOStream *)local_58,
                      *(aiCamera **)(*(long *)(chunk.initial + 0x68) + (ulong)cam._4_4_ * 8));
  }
  AssbinChunkWriter::~AssbinChunkWriter((AssbinChunkWriter *)local_58);
  return;
}

Assistant:

void WriteBinaryScene( IOStream * container, const aiScene* scene)
    {
        AssbinChunkWriter chunk( container, ASSBIN_CHUNK_AISCENE );

        // basic scene information
        Write<unsigned int>(&chunk,scene->mFlags);
        Write<unsigned int>(&chunk,scene->mNumMeshes);
        Write<unsigned int>(&chunk,scene->mNumMaterials);
        Write<unsigned int>(&chunk,scene->mNumAnimations);
        Write<unsigned int>(&chunk,scene->mNumTextures);
        Write<unsigned int>(&chunk,scene->mNumLights);
        Write<unsigned int>(&chunk,scene->mNumCameras);

        // write node graph
        WriteBinaryNode( &chunk, scene->mRootNode );

        // write all meshes
        for (unsigned int i = 0; i < scene->mNumMeshes;++i) {
            const aiMesh* mesh = scene->mMeshes[i];
            WriteBinaryMesh( &chunk,mesh);
        }

        // write materials
        for (unsigned int i = 0; i< scene->mNumMaterials; ++i) {
            const aiMaterial* mat = scene->mMaterials[i];
            WriteBinaryMaterial(&chunk,mat);
        }

        // write all animations
        for (unsigned int i = 0; i < scene->mNumAnimations;++i) {
            const aiAnimation* anim = scene->mAnimations[i];
            WriteBinaryAnim(&chunk,anim);
        }


        // write all textures
        for (unsigned int i = 0; i < scene->mNumTextures;++i) {
            const aiTexture* mesh = scene->mTextures[i];
            WriteBinaryTexture(&chunk,mesh);
        }

        // write lights
        for (unsigned int i = 0; i < scene->mNumLights;++i) {
            const aiLight* l = scene->mLights[i];
            WriteBinaryLight(&chunk,l);
        }

        // write cameras
        for (unsigned int i = 0; i < scene->mNumCameras;++i) {
            const aiCamera* cam = scene->mCameras[i];
            WriteBinaryCamera(&chunk,cam);
        }

    }